

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.cpp
# Opt level: O0

bool __thiscall AlphaVector::EqualValues(AlphaVector *this,AlphaVector *alpha)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  AlphaVector *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *values;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  uVar2 = GetNrValues((AlphaVector *)0x903eed);
  uVar3 = GetNrValues((AlphaVector *)0x903efb);
  if (uVar2 == uVar3) {
    GetValues(in_RSI);
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffc8);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AlphaVector::EqualValues(const AlphaVector &alpha) const
{
    if(this->GetNrValues()!=alpha.GetNrValues())
        return(false);

    const vector<double> &values=alpha.GetValues();

    if(_m_values!=values)
        return(false);

    // else
    return(true);
}